

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# djpeg.c
# Opt level: O0

uint jpeg_getc(j_decompress_ptr cinfo)

{
  undefined8 *puVar1;
  byte *pbVar2;
  int iVar3;
  long *in_RDI;
  jpeg_source_mgr *datasrc;
  
  puVar1 = (undefined8 *)in_RDI[5];
  if ((puVar1[1] == 0) && (iVar3 = (*(code *)puVar1[3])(in_RDI), iVar3 == 0)) {
    *(undefined4 *)(*in_RDI + 0x28) = 0x18;
    (**(code **)*in_RDI)(in_RDI);
  }
  puVar1[1] = puVar1[1] + -1;
  pbVar2 = (byte *)*puVar1;
  *puVar1 = pbVar2 + 1;
  return (uint)*pbVar2;
}

Assistant:

LOCAL(unsigned int)
jpeg_getc(j_decompress_ptr cinfo)
/* Read next byte */
{
  struct jpeg_source_mgr *datasrc = cinfo->src;

  if (datasrc->bytes_in_buffer == 0) {
    if (!(*datasrc->fill_input_buffer) (cinfo))
      ERREXIT(cinfo, JERR_CANT_SUSPEND);
  }
  datasrc->bytes_in_buffer--;
  return *datasrc->next_input_byte++;
}